

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preEnd__profile_GLES__technique__pass__states__blend_func__dest
          (ColladaParserAutoGen15Private *this)

{
  ColladaParserAutoGen15Private *this_local;
  
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__profile_GLES__technique__pass__states__blend_func__dest()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__profile_GLES__technique__pass__states__blend_func__dest();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}